

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void __thiscall
duckdb::DictionaryCompressionCompressState::AddNull(DictionaryCompressionCompressState *this)

{
  atomic<unsigned_long> *paVar1;
  iterator __position;
  pointer pCVar2;
  uint local_c;
  
  local_c = 0;
  __position._M_current =
       (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&(this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
               __position,&local_c);
  }
  else {
    *__position._M_current = 0;
    (this->selection_buffer).super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  LOCK();
  paVar1 = &(pCVar2->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void DictionaryCompressionCompressState::AddNull() {
	selection_buffer.push_back(0);
	current_segment->count++;
}